

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void cpu_mips_store_cause_mips64el(CPUMIPSState_conflict5 *env,target_ulong val)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)env->insn_flags;
  uVar2 = 0;
  if ((uVar1 >> 0xd & 1) != 0) {
    uVar2 = (uint)val & 0x400000;
  }
  env->CP0_Cause =
       ((uint)val ^ env->CP0_Cause) & (uVar2 ^ ((uVar1 & 0x40) << 0x15 | 0xc00300)) ^ env->CP0_Cause
  ;
  return;
}

Assistant:

void cpu_mips_store_cause(CPUMIPSState *env, target_ulong val)
{
    uint32_t mask = 0x00C00300;

    if (env->insn_flags & ISA_MIPS32R2) {
        mask |= 1 << CP0Ca_DC;
    }
    if (env->insn_flags & ISA_MIPS32R6) {
        mask &= ~((1 << CP0Ca_WP) & val);
    }

    env->CP0_Cause = (env->CP0_Cause & ~mask) | (val & mask);

#if 0
    uint32_t old = env->CP0_Cause;
    if ((old ^ env->CP0_Cause) & (1 << CP0Ca_DC)) {
        if (env->CP0_Cause & (1 << CP0Ca_DC)) {
            cpu_mips_stop_count(env);
        } else {
            cpu_mips_start_count(env);
        }
    }

    int i;
    /* Set/reset software interrupts */
    for (i = 0 ; i < 2 ; i++) {
        if ((old ^ env->CP0_Cause) & (1 << (CP0Ca_IP + i))) {
            cpu_mips_soft_irq(env, i, env->CP0_Cause & (1 << (CP0Ca_IP + i)));
        }
    }
#endif
}